

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChessEngine.cpp
# Opt level: O1

uint64_t __thiscall senjo::ChessEngine::Perft(ChessEngine *this,int depth)

{
  int iVar1;
  undefined4 extraout_var;
  timeval tv;
  timeval local_28;
  
  _stop._0_1_ = (byte)_stop & 0xfd;
  _searching = 0;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  _startTime = local_28.tv_usec / 1000 + local_28.tv_sec * 1000;
  _stopTime = 0;
  iVar1 = (*this->_vptr_ChessEngine[0x1c])(this,depth);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

uint64_t ChessEngine::Perft(const int depth)
{
  _stop &= ~StopReason::Timeout;
  _searching = false;
  _startTime = Now();
  _stopTime = 0;
  return MyPerft(depth);
}